

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall re2::SparseArray<int>::~SparseArray(SparseArray<int> *this)

{
  SparseArray<int> *in_RDI;
  
  DebugCheckInvariants(in_RDI);
  PODArray<re2::SparseArray<int>::IndexValue>::~PODArray
            ((PODArray<re2::SparseArray<int>::IndexValue> *)0x169158);
  PODArray<int>::~PODArray((PODArray<int> *)0x169166);
  return;
}

Assistant:

SparseArray<Value>::~SparseArray() {
  DebugCheckInvariants();
}